

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

ssize_t __thiscall parser::state::read(state *this,int __fd,void *__buf,size_t __nbytes)

{
  stream_type *psVar1;
  long lVar2;
  ind iVar3;
  _Map_pointer ppcVar4;
  _Map_pointer ppcVar5;
  _Elt_pointer pcVar6;
  _Elt_pointer pcVar7;
  _Elt_pointer pcVar8;
  _Elt_pointer pcVar9;
  _Elt_pointer puVar10;
  long lVar11;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  char *__first;
  undefined4 in_register_00000034;
  long lVar12;
  undefined8 uStack_80;
  const_iterator local_78;
  iterator local_58;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  lVar11 = -(CONCAT44(in_register_00000034,__fd) + 0xfU & 0xfffffffffffffff0);
  __first = (char *)((long)&local_78 + lVar11);
  psVar1 = this->in;
  *(undefined8 *)((long)&uStack_80 + lVar11) = 0x13212d;
  std::istream::read((char *)psVar1,(long)__first);
  lVar2 = *(long *)(this->in + 8);
  if (lVar2 != 0) {
    iVar3 = (this->off).i;
    ppcVar4 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppcVar5 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    pcVar6 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    pcVar7 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    pcVar8 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pcVar9 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    local_38 = &this->lines;
    lVar12 = 0;
    do {
      this_00 = local_38;
      if (__first[lVar12] == '\n') {
        local_58._M_cur =
             pcVar6 + (long)(pcVar7 + lVar12 + (((((((ulong)((long)ppcVar4 - (long)ppcVar5) >> 3) -
                                                   1) + (ulong)(ppcVar4 == (_Map_pointer)0x0)) *
                                                  0x200 + iVar3) - (long)pcVar8) - (long)pcVar9) + 1
                            );
        puVar10 = (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (puVar10 ==
            (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last + -1) {
          *(undefined8 *)((long)&uStack_80 + lVar11) = 0x1321c7;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
                    (this_00,(unsigned_long *)&local_58);
        }
        else {
          *puVar10 = (unsigned_long)local_58._M_cur;
          (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = puVar10 + 1;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar2 != lVar12);
  }
  local_78._M_cur =
       (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  local_78._M_first =
       (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  local_78._M_last =
       (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  local_78._M_node =
       (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  *(undefined8 *)((long)&uStack_80 + lVar11) = 0x1321f8;
  std::deque<char,std::allocator<char>>::insert<char*,void>
            (&local_58,(deque<char,std::allocator<char>> *)&this->str,&local_78,__first,
             __first + lVar2);
  return lVar2;
}

Assistant:

ind read(ind n) {
			value_type s[n];
			// Read into buffer
			in.read(s, n);
			// Count read characters
			ind r = in.gcount();
			// Track newlines
			ind i_max = off.i + str.size();
			for (ind i = 0; i < r; ++i) {
				if ( s[i] == '\n' ) { lines.push_back(i_max + i + 1); }
			}
			// Add to stored input
			str.insert(str.end(), s, s+r);
			return r;
		}